

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O3

lzma_ret lzma_lzma_encode(lzma_lzma1_encoder *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                         size_t out_size,uint32_t limit)

{
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  lzma_lzma_state lVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  lzma_lzma_state lVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint uVar17;
  bool bVar18;
  uint32_t len;
  uint32_t back;
  uint32_t local_88;
  uint local_84;
  probability (*local_80) [16];
  uint8_t *local_78;
  size_t local_70;
  probability *local_68;
  probability *local_60;
  probability *local_58;
  probability (*local_50) [16];
  lzma_length_encoder *local_48;
  probability *local_40;
  probability (*local_38) [768];
  
  local_78 = out;
  local_70 = out_size;
  if (coder->is_initialized == true) {
    uVar16 = mf->read_ahead;
  }
  else {
    uVar16 = mf->read_pos;
    if (uVar16 != mf->read_ahead) {
      __assert_fail("mf_position(mf) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x10e,"_Bool encode_init(lzma_lzma1_encoder *, lzma_mf *)");
    }
    if (uVar16 == mf->read_limit) {
      if (mf->action == LZMA_RUN) {
        return LZMA_OK;
      }
      if (mf->write_pos != uVar16) {
        __assert_fail("mf->write_pos == mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x115,"_Bool encode_init(lzma_lzma1_encoder *, lzma_mf *)");
      }
      if (mf->action != LZMA_FINISH) {
        __assert_fail("mf->action == LZMA_FINISH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x116,"_Bool encode_init(lzma_lzma1_encoder *, lzma_mf *)");
      }
    }
    else {
      uVar13 = 1;
      (*mf->skip)(mf,1);
      mf->read_ahead = 0;
      sVar11 = (coder->rc).count;
      (coder->rc).symbols[sVar11] = RC_BIT_0;
      (coder->rc).probs[sVar11] = coder->is_match[0];
      (coder->rc).count = sVar11 + 1;
      bVar1 = *mf->buffer;
      uVar17 = 7;
      lVar12 = sVar11 + 0x23;
      do {
        lVar10 = lVar12;
        bVar18 = (bVar1 >> (uVar17 & 0x1f) & 1) != 0;
        *(uint *)((long)coder + lVar10 * 4 + -0x60) = (uint)bVar18;
        *(probability **)((coder->rc).symbols + lVar10 * 2 + -10) = coder->literal[0] + uVar13;
        uVar13 = (ulong)((uint)bVar18 + (int)uVar13 * 2);
        bVar18 = uVar17 != 0;
        uVar17 = uVar17 - 1;
        lVar12 = lVar10 + 1;
      } while (bVar18);
      (coder->rc).count = lVar10 - 0x21;
      uVar16 = 0;
    }
    coder->is_initialized = true;
  }
  uVar3 = mf->read_pos;
  _Var6 = rc_encode(&coder->rc,local_78,out_pos,local_70);
  if (!_Var6) {
    uVar17 = uVar3 - uVar16;
    local_80 = coder->is_match;
    local_60 = coder->is_rep;
    local_68 = coder->is_rep0;
    local_40 = coder->is_rep1;
    local_58 = coder->is_rep2;
    local_50 = coder->is_rep0_long;
    local_48 = &coder->rep_len_encoder;
    local_38 = coder->literal;
    do {
      if ((limit != 0xffffffff) &&
         ((limit <= mf->read_pos - mf->read_ahead ||
          (0xeffe < *out_pos + (coder->rc).cache_size + 4)))) {
LAB_001a6eb8:
        if (coder->is_flushed == false) {
          coder->is_flushed = true;
          if (limit == 0xffffffff) {
            uVar17 = uVar17 & coder->pos_mask;
            lVar4 = coder->state;
            sVar11 = (coder->rc).count;
            (coder->rc).symbols[sVar11] = RC_BIT_1;
            (coder->rc).probs[sVar11] = local_80[lVar4] + uVar17;
            lVar4 = coder->state;
            (coder->rc).symbols[sVar11 + 1] = RC_BIT_0;
            (coder->rc).probs[sVar11 + 1] = local_60 + lVar4;
            (coder->rc).count = sVar11 + 2;
            match(coder,uVar17,0xffffffff,2);
          }
          sVar11 = (coder->rc).count;
          lVar12 = 5;
          do {
            (coder->rc).symbols[sVar11] = RC_FLUSH;
            sVar11 = sVar11 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          (coder->rc).count = sVar11;
          _Var6 = rc_encode(&coder->rc,local_78,out_pos,local_70);
          if (_Var6) {
            if (limit == 0xffffffff) {
              return LZMA_OK;
            }
            __assert_fail("limit == UINT32_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                          ,0x188,
                          "lzma_ret lzma_lzma_encode(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                         );
          }
        }
        coder->is_flushed = false;
        return LZMA_STREAM_END;
      }
      if (mf->read_limit <= mf->read_pos) {
        if (mf->action == LZMA_RUN) {
          return LZMA_OK;
        }
        if (mf->read_ahead == 0) goto LAB_001a6eb8;
      }
      if (coder->fast_mode == true) {
        lzma_lzma_optimum_fast(coder,mf,&local_84,&local_88);
      }
      else {
        lzma_lzma_optimum_normal(coder,mf,&local_84,&local_88,uVar17);
      }
      uVar16 = local_88;
      uVar13 = (ulong)local_84;
      uVar7 = coder->pos_mask & uVar17;
      if (uVar13 == 0xffffffff) {
        if (local_88 != 1) {
          __assert_fail("len == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                        ,0xf1,
                        "void encode_symbol(lzma_lzma1_encoder *, lzma_mf *, uint32_t, uint32_t, uint32_t)"
                       );
        }
        lVar4 = coder->state;
        sVar11 = (coder->rc).count;
        (coder->rc).symbols[sVar11] = RC_BIT_0;
        (coder->rc).probs[sVar11] = local_80[lVar4] + uVar7;
        (coder->rc).count = sVar11 + 1;
        uVar7 = mf->read_pos - mf->read_ahead;
        puVar5 = mf->buffer;
        bVar1 = (byte)coder->literal_context_bits;
        bVar2 = puVar5[uVar7];
        uVar15 = (uint)(puVar5[uVar7 - 1] >> (8 - bVar1 & 0x1f)) +
                 ((coder->literal_pos_mask & uVar17) << (bVar1 & 0x1f));
        if (coder->state < STATE_LIT_MATCH) {
          lVar12 = sVar11 + 0x23;
          uVar13 = 1;
          uVar7 = 7;
          do {
            bVar18 = (bVar2 >> (uVar7 & 0x1f) & 1) != 0;
            *(uint *)((long)coder + lVar12 * 4 + -0x60) = (uint)bVar18;
            *(probability **)((coder->rc).symbols + lVar12 * 2 + -10) = local_38[uVar15] + uVar13;
            uVar13 = (ulong)((uint)bVar18 + (int)uVar13 * 2);
            lVar12 = lVar12 + 1;
            bVar18 = uVar7 != 0;
            uVar7 = uVar7 - 1;
          } while (bVar18);
        }
        else {
          uVar7 = (uint)puVar5[uVar7 + ~coder->reps[0]];
          lVar12 = sVar11 + 0x23;
          uVar14 = 0x100;
          uVar8 = bVar2 | 0x100;
          do {
            uVar7 = uVar7 * 2;
            *(uint *)((long)coder + lVar12 * 4 + -0x60) = uVar8 >> 7 & 1;
            *(probability **)((coder->rc).symbols + lVar12 * 2 + -10) =
                 local_38[uVar15] + ((uVar8 >> 8) + uVar14 + (uVar7 & uVar14));
            uVar14 = uVar14 & ~(uVar8 * 2 ^ uVar7);
            lVar12 = lVar12 + 1;
            bVar18 = uVar8 < 0x8000;
            uVar8 = uVar8 * 2;
          } while (bVar18);
        }
        (coder->rc).count = lVar12 - 0x22;
        lVar4 = coder->state;
        lVar9 = STATE_LIT_LIT;
        if (STATE_SHORTREP_LIT_LIT < lVar4) {
          if (lVar4 < STATE_NONLIT_MATCH) {
            lVar9 = lVar4 - STATE_SHORTREP_LIT_LIT;
          }
          else {
            lVar9 = lVar4 - STATE_SHORTREP_LIT;
          }
        }
LAB_001a6e67:
        coder->state = lVar9;
      }
      else {
        lVar4 = coder->state;
        sVar11 = (coder->rc).count;
        (coder->rc).symbols[sVar11] = RC_BIT_1;
        (coder->rc).probs[sVar11] = local_80[lVar4] + uVar7;
        lVar4 = coder->state;
        if (local_84 < 4) {
          (coder->rc).symbols[sVar11 + 1] = RC_BIT_1;
          (coder->rc).probs[sVar11 + 1] = local_60 + lVar4;
          if (uVar13 == 0) {
            lVar4 = coder->state;
            (coder->rc).symbols[sVar11 + 2] = RC_BIT_0;
            (coder->rc).probs[sVar11 + 2] = local_68 + lVar4;
            lVar4 = coder->state;
            (coder->rc).symbols[sVar11 + 3] = (uint)(local_88 != 1);
            (coder->rc).probs[sVar11 + 3] = local_50[lVar4] + uVar7;
            (coder->rc).count = sVar11 + 4;
          }
          else {
            uVar3 = coder->reps[uVar13];
            lVar4 = coder->state;
            (coder->rc).symbols[sVar11 + 2] = RC_BIT_1;
            (coder->rc).probs[sVar11 + 2] = local_68 + lVar4;
            lVar4 = coder->state;
            if (uVar13 == 1) {
              (coder->rc).symbols[sVar11 + 3] = RC_BIT_0;
              (coder->rc).probs[sVar11 + 3] = local_40 + lVar4;
              (coder->rc).count = sVar11 + 4;
            }
            else {
              (coder->rc).symbols[sVar11 + 3] = RC_BIT_1;
              (coder->rc).probs[sVar11 + 3] = local_40 + lVar4;
              lVar4 = coder->state;
              (coder->rc).symbols[sVar11 + 4] = local_84 - RC_DIRECT_0;
              (coder->rc).probs[sVar11 + 4] = local_58 + lVar4;
              (coder->rc).count = sVar11 + 5;
              if (uVar13 == 3) {
                coder->reps[3] = coder->reps[2];
              }
              coder->reps[2] = coder->reps[1];
            }
            coder->reps[1] = coder->reps[0];
            coder->reps[0] = uVar3;
          }
          lVar9 = STATE_LIT_SHORTREP;
          if (local_88 != 1) {
            length(&coder->rc,local_48,uVar7,local_88,coder->fast_mode);
            lVar9 = STATE_LIT_LONGREP;
          }
          if (STATE_SHORTREP_LIT < coder->state) {
            lVar9 = STATE_NONLIT_REP;
          }
          goto LAB_001a6e67;
        }
        (coder->rc).symbols[sVar11 + 1] = RC_BIT_0;
        (coder->rc).probs[sVar11 + 1] = local_60 + lVar4;
        (coder->rc).count = sVar11 + 2;
        match(coder,uVar7,local_84 - 4,local_88);
      }
      if (mf->read_ahead < uVar16) {
        __assert_fail("mf->read_ahead >= len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                      ,0x106,
                      "void encode_symbol(lzma_lzma1_encoder *, lzma_mf *, uint32_t, uint32_t, uint32_t)"
                     );
      }
      mf->read_ahead = mf->read_ahead - uVar16;
      uVar17 = uVar17 + local_88;
      _Var6 = rc_encode(&coder->rc,local_78,out_pos,local_70);
    } while (!_Var6);
  }
  if (limit == 0xffffffff) {
    return LZMA_OK;
  }
  __assert_fail("limit == UINT32_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                ,0x14b,
                "lzma_ret lzma_lzma_encode(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
               );
}

Assistant:

extern lzma_ret
lzma_lzma_encode(lzma_lzma1_encoder *restrict coder, lzma_mf *restrict mf,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size, uint32_t limit)
{
	// Initialize the stream if no data has been encoded yet.
	if (!coder->is_initialized && !encode_init(coder, mf))
		return LZMA_OK;

	// Get the lowest bits of the uncompressed offset from the LZ layer.
	uint32_t position = mf_position(mf);

	while (true) {
		// Encode pending bits, if any. Calling this before encoding
		// the next symbol is needed only with plain LZMA, since
		// LZMA2 always provides big enough buffer to flush
		// everything out from the range encoder. For the same reason,
		// rc_encode() never returns true when this function is used
		// as part of LZMA2 encoder.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}

		// With LZMA2 we need to take care that compressed size of
		// a chunk doesn't get too big.
		// FIXME? Check if this could be improved.
		if (limit != UINT32_MAX
				&& (mf->read_pos - mf->read_ahead >= limit
					|| *out_pos + rc_pending(&coder->rc)
						>= LZMA2_CHUNK_MAX
							- LOOP_INPUT_MAX))
			break;

		// Check that there is some input to process.
		if (mf->read_pos >= mf->read_limit) {
			if (mf->action == LZMA_RUN)
				return LZMA_OK;

			if (mf->read_ahead == 0)
				break;
		}

		// Get optimal match (repeat position and length).
		// Value ranges for pos:
		//   - [0, REPS): repeated match
		//   - [REPS, UINT32_MAX):
		//     match at (pos - REPS)
		//   - UINT32_MAX: not a match but a literal
		// Value ranges for len:
		//   - [MATCH_LEN_MIN, MATCH_LEN_MAX]
		uint32_t len;
		uint32_t back;

		if (coder->fast_mode)
			lzma_lzma_optimum_fast(coder, mf, &back, &len);
		else
			lzma_lzma_optimum_normal(
					coder, mf, &back, &len, position);

		encode_symbol(coder, mf, back, len, position);

		position += len;
	}

	if (!coder->is_flushed) {
		coder->is_flushed = true;

		// We don't support encoding plain LZMA streams without EOPM,
		// and LZMA2 doesn't use EOPM at LZMA level.
		if (limit == UINT32_MAX)
			encode_eopm(coder, position);

		// Flush the remaining bytes from the range encoder.
		rc_flush(&coder->rc);

		// Copy the remaining bytes to the output buffer. If there
		// isn't enough output space, we will copy out the remaining
		// bytes on the next call to this function by using
		// the rc_encode() call in the encoding loop above.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}
	}

	// Make it ready for the next LZMA2 chunk.
	coder->is_flushed = false;

	return LZMA_STREAM_END;
}